

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::GenerateCxxModuleConfigInformation
          (cmExportBuildFileGenerator *this,string *name,ostream *os)

{
  pointer pbVar1;
  ostream *poVar2;
  char *pcVar3;
  pointer pbVar4;
  string c;
  
  pbVar4 = (this->super_cmExportFileGenerator).Configurations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmExportFileGenerator).Configurations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar3 = "";
  if (0x20 < (ulong)((long)pbVar1 - (long)pbVar4)) {
    pcVar3 = " OPTIONAL";
  }
  for (; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::__cxx11::string::string((string *)&c,(string *)pbVar4);
    if (c._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&c);
    }
    poVar2 = std::operator<<(os,"include(\"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-");
    poVar2 = std::operator<<(poVar2,(string *)name);
    poVar2 = std::operator<<(poVar2,'-');
    poVar2 = std::operator<<(poVar2,(string *)&c);
    poVar2 = std::operator<<(poVar2,".cmake\"");
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string((string *)&c);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateCxxModuleConfigInformation(
  std::string const& name, std::ostream& os) const
{
  const char* opt = "";
  if (this->Configurations.size() > 1) {
    // With more than one configuration, each individual file is optional.
    opt = " OPTIONAL";
  }

  // Generate import file content for each configuration.
  for (std::string c : this->Configurations) {
    if (c.empty()) {
      c = "noconfig";
    }
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-" << name << '-'
       << c << ".cmake\"" << opt << ")\n";
  }
}